

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O0

void __thiscall
Secp256k1_EmptyContextErrorTest_Test::TestBody(Secp256k1_EmptyContextErrorTest_Test *this)

{
  allocator<cfd::core::ByteData> *this_00;
  initializer_list<cfd::core::ByteData> __l;
  bool bVar1;
  ByteData *local_150;
  AssertHelper local_128;
  Message local_120 [2];
  CfdException *anon_var_0;
  undefined1 local_108 [8];
  ByteData actual;
  char *pcStack_e8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_d8;
  allocator local_a1;
  string local_a0;
  ByteData *local_80;
  ByteData local_78;
  ByteData local_60;
  undefined1 local_48 [24];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> test_vector;
  Secp256k1 secp;
  secp256k1_context_struct *cxt;
  Secp256k1_EmptyContextErrorTest_Test *this_local;
  
  cfd::core::Secp256k1::Secp256k1
            ((Secp256k1 *)
             &test_vector.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(void *)0x0);
  gtest_msg.value._6_1_ = 1;
  local_80 = &local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,
             "03662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9",&local_a1);
  cfd::core::ByteData::ByteData(&local_78,&local_a0);
  local_80 = &local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,
             "0261e37f277f02a977b4f11eb5055abab4990bbf8dee701119d88df382fcc1fafe",
             (allocator *)((long)&gtest_msg.value + 7));
  cfd::core::ByteData::ByteData(&local_60,&local_d8);
  gtest_msg.value._6_1_ = 0;
  local_48._0_8_ = &local_78;
  local_48._8_8_ = (pointer)0x2;
  this_00 = (allocator<cfd::core::ByteData> *)((long)&gtest_msg.value + 5);
  std::allocator<cfd::core::ByteData>::allocator(this_00);
  __l._M_len = local_48._8_8_;
  __l._M_array = (iterator)local_48._0_8_;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)(local_48 + 0x10),
             __l,this_00);
  std::allocator<cfd::core::ByteData>::~allocator
            ((allocator<cfd::core::ByteData> *)((long)&gtest_msg.value + 5));
  local_150 = (ByteData *)local_48;
  do {
    local_150 = local_150 + -1;
    cfd::core::ByteData::~ByteData(local_150);
  } while (local_150 != &local_78);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff18,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff18);
  if (bVar1) {
    actual.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Secp256k1::CombinePubkeySecp256k1Ec
                ((ByteData *)local_108,
                 (Secp256k1 *)
                 &test_vector.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 (local_48 + 0x10));
      cfd::core::ByteData::~ByteData((ByteData *)local_108);
    }
    if ((actual.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) goto LAB_004c5ac1;
    pcStack_e8 = 
    "Expected: ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_120);
  testing::internal::AssertHelper::AssertHelper
            (&local_128,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_secp256k1.cpp"
             ,0x93,pcStack_e8);
  testing::internal::AssertHelper::operator=(&local_128,local_120);
  testing::internal::AssertHelper::~AssertHelper(&local_128);
  testing::Message::~Message(local_120);
LAB_004c5ac1:
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)(local_48 + 0x10))
  ;
  return;
}

Assistant:

TEST(Secp256k1, EmptyContextErrorTest) {
  struct secp256k1_context_struct *cxt = nullptr;
  Secp256k1 secp = Secp256k1(cxt);

  std::vector<ByteData> test_vector =
      { ByteData(
          "03662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9"),
          ByteData(
              "0261e37f277f02a977b4f11eb5055abab4990bbf8dee701119d88df382fcc1fafe") };
  EXPECT_THROW(ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector),
               CfdException);
}